

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

Type * __thiscall
Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
          (Type *__return_storage_ptr__,
          MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>> *this,
          MatrixBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *other)

{
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *a_lhs;
  ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *a_rhs;
  MatrixBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *other_local;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *this_local;
  
  a_lhs = EigenBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::derived
                    ((EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)this);
  a_rhs = EigenBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::derived((EigenBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                     *)other);
  GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>
  ::GeneralProduct(__return_storage_ptr__,a_lhs,a_rhs);
  return __return_storage_ptr__;
}

Assistant:

inline const typename ProductReturnType<Derived, OtherDerived>::Type
MatrixBase<Derived>::operator*(const MatrixBase<OtherDerived> &other) const
{
  // A note regarding the function declaration: In MSVC, this function will sometimes
  // not be inlined since DenseStorage is an unwindable object for dynamic
  // matrices and product types are holding a member to store the result.
  // Thus it does not help tagging this function with EIGEN_STRONG_INLINE.
  enum {
    ProductIsValid =  Derived::ColsAtCompileTime==Dynamic
                   || OtherDerived::RowsAtCompileTime==Dynamic
                   || int(Derived::ColsAtCompileTime)==int(OtherDerived::RowsAtCompileTime),
    AreVectors = Derived::IsVectorAtCompileTime && OtherDerived::IsVectorAtCompileTime,
    SameSizes = EIGEN_PREDICATE_SAME_MATRIX_SIZE(Derived,OtherDerived)
  };
  // note to the lost user:
  //    * for a dot product use: v1.dot(v2)
  //    * for a coeff-wise product use: v1.cwiseProduct(v2)
  EIGEN_STATIC_ASSERT(ProductIsValid || !(AreVectors && SameSizes),
    INVALID_VECTOR_VECTOR_PRODUCT__IF_YOU_WANTED_A_DOT_OR_COEFF_WISE_PRODUCT_YOU_MUST_USE_THE_EXPLICIT_FUNCTIONS)
  EIGEN_STATIC_ASSERT(ProductIsValid || !(SameSizes && !AreVectors),
    INVALID_MATRIX_PRODUCT__IF_YOU_WANTED_A_COEFF_WISE_PRODUCT_YOU_MUST_USE_THE_EXPLICIT_FUNCTION)
  EIGEN_STATIC_ASSERT(ProductIsValid || SameSizes, INVALID_MATRIX_PRODUCT)
#ifdef EIGEN_DEBUG_PRODUCT
  internal::product_type<Derived,OtherDerived>::debug();
#endif
  return typename ProductReturnType<Derived,OtherDerived>::Type(derived(), other.derived());
}